

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O0

bool bgp_update(bgp_peer *peer,uchar *buff,int entire_length)

{
  node<adj_ribs_in_data> *root;
  uint32_t prefix_00;
  uint8_t prefix_len_00;
  uint16_t unfeasible_routes_length_00;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  adj_ribs_in_data in_stack_fffffffffffffc58;
  undefined8 local_280 [35];
  node<adj_ribs_in_data> *local_168;
  node<adj_ribs_in_data> *added;
  bool is_updated;
  char *pcStack_158;
  uint local_14c;
  uint32_t local_148;
  int prefix_len;
  uint32_t prefix;
  uint16_t total_path_attribute_length;
  adj_ribs_in_data route_data;
  int read_length;
  uint16_t unfeasible_routes_length;
  int entire_length_local;
  uchar *buff_local;
  bgp_peer *peer_local;
  
  bVar4 = 0;
  unfeasible_routes_length_00 = ntohs(*(uint16_t *)(buff + 0x13));
  bgp_update_handle_unfeasible_prefix(peer,buff,unfeasible_routes_length_00);
  adj_ribs_in_data::adj_ribs_in_data((adj_ribs_in_data *)&prefix);
  prefix_len._2_2_ = *(uint16_t *)(buff + (int)(unfeasible_routes_length_00 + 0x15));
  prefix_len._2_2_ = ntohs(prefix_len._2_2_);
  bgp_update_handle_path_attribute
            (peer,buff,unfeasible_routes_length_00,prefix_len._2_2_,(adj_ribs_in_data *)&prefix);
  route_data.installed_loc_rib_node._4_4_ =
       unfeasible_routes_length_00 + 0x17 + (uint)prefix_len._2_2_;
  do {
    if (entire_length <= route_data.installed_loc_rib_node._4_4_) {
      return true;
    }
    local_14c = (uint)buff[route_data.installed_loc_rib_node._4_4_];
    if (local_14c < 9) {
      local_148 = (uint)buff[route_data.installed_loc_rib_node._4_4_ + 1] << 0x18;
      route_data.installed_loc_rib_node._4_4_ = route_data.installed_loc_rib_node._4_4_ + 2;
    }
    else if (local_14c < 0x11) {
      local_148 = (uint)buff[route_data.installed_loc_rib_node._4_4_ + 1] * 0x1000000 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 2] * 0x10000;
      route_data.installed_loc_rib_node._4_4_ = route_data.installed_loc_rib_node._4_4_ + 3;
    }
    else if (local_14c < 0x19) {
      local_148 = (uint)buff[route_data.installed_loc_rib_node._4_4_ + 1] * 0x1000000 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 2] * 0x10000 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 3] * 0x100;
      route_data.installed_loc_rib_node._4_4_ = route_data.installed_loc_rib_node._4_4_ + 4;
    }
    else {
      if (0x20 < local_14c) {
        log<>(ERROR,"Invalid packet");
        return true;
      }
      local_148 = (uint)buff[route_data.installed_loc_rib_node._4_4_ + 1] * 0x1000000 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 2] * 0x10000 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 3] * 0x100 +
                  (uint)buff[route_data.installed_loc_rib_node._4_4_ + 4];
      route_data.installed_loc_rib_node._4_4_ = route_data.installed_loc_rib_node._4_4_ + 5;
    }
    added._4_4_ = ntohl(local_148);
    pcStack_158 = inet_ntoa(added._4_4_);
    log<char*,int>(DEBUG,"%s/%d",&stack0xfffffffffffffea8,(int *)&local_14c);
    prefix_00 = local_148;
    root = peer->adj_ribs_in;
    prefix_len_00 = (uint8_t)local_14c;
    memcpy(local_280,&prefix,0x118);
    puVar2 = local_280;
    puVar3 = (undefined8 *)&stack0xfffffffffffffc58;
    for (lVar1 = 0x23; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    local_168 = add_prefix<adj_ribs_in_data>
                          (root,prefix_00,prefix_len_00,in_stack_fffffffffffffc58,
                           (bool *)((long)&added + 3));
    if ((added._3_1_ & 1) == 0) {
      peer->route_count = peer->route_count + 1;
    }
    else {
      log<>(DEBUG,"Route updated!");
    }
    attempt_to_install_bgp_loc_rib(peer,local_168);
  } while( true );
}

Assistant:

bool bgp_update(bgp_peer* peer,  unsigned char* buff, int entire_length){
    uint16_t unfeasible_routes_length;
    memcpy(&unfeasible_routes_length, &buff[19], 2);
    unfeasible_routes_length = ntohs(unfeasible_routes_length);
    int read_length;

    bgp_update_handle_unfeasible_prefix(peer, buff, unfeasible_routes_length);

    adj_ribs_in_data route_data;
    uint16_t total_path_attribute_length;
    memcpy(&total_path_attribute_length, &buff[19 + 2 + unfeasible_routes_length], 2);
    total_path_attribute_length = ntohs(total_path_attribute_length);

    bgp_update_handle_path_attribute(peer, buff, unfeasible_routes_length, total_path_attribute_length, route_data);

    read_length = 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length;

    while(read_length < entire_length){
        uint32_t prefix;
        int prefix_len = buff[read_length];
        if(prefix_len <= 8){
            prefix = buff[read_length + 1]*256*256*256;
            read_length += 2;
        }else if(prefix_len <= 16){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256;
            read_length += 3;
        }else if(prefix_len <= 24){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256;
            read_length += 4;
        }else if(prefix_len <= 32){
            prefix = buff[read_length + 1]*256*256*256 + buff[read_length + 2]*256*256 + buff[read_length + 3]*256 + buff[read_length + 4];
            read_length += 5;
        }else{
            log(log_level::ERROR, "Invalid packet");
            break;
        }
        log(log_level::DEBUG, "%s/%d", inet_ntoa(in_addr{.s_addr=ntohl(prefix)}), prefix_len);
        bool is_updated;
        node<adj_ribs_in_data>* added = add_prefix(peer->adj_ribs_in, prefix, prefix_len, route_data, &is_updated);
        if(!is_updated){
            peer->route_count++;
        }else{
            log(log_level::DEBUG, "Route updated!");
        }
        attempt_to_install_bgp_loc_rib(peer, added);
    }
    return true;
}